

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O2

uc_err uc_context_restore(uc_engine *uc,uc_context *context)

{
  int iVar1;
  int iVar2;
  MemoryRegion *pMVar3;
  uint64_t begin;
  undefined1 a [16];
  Int128 IVar4;
  _Bool _Var5;
  uc_context_content uVar6;
  uc_err uVar7;
  undefined8 unaff_RBX;
  MemoryRegion *pMVar8;
  ulong uVar9;
  
  if ((uc->init_done != false) || (uVar7 = uc_init_engine(uc), uVar7 == UC_ERR_OK)) {
    uVar6 = uc->context_content;
    if ((uVar6 & UC_CTL_CONTEXT_MEMORY) != 0) {
      uc->snapshot_level = context->snapshot_level;
      pMVar3 = (uc->system_memory->subregions).tqh_first;
      while (pMVar8 = pMVar3, pMVar8 != (MemoryRegion *)0x0) {
        pMVar3 = (pMVar8->subregions_link).tqe_next;
        (*uc->memory_filter_subregions)(pMVar8,uc->snapshot_level);
        if ((pMVar8->subregions).tqh_first == (MemoryRegion *)0x0) {
          (*uc->memory_unmap)(uc,pMVar8);
        }
      }
      uVar9 = (ulong)uc->unmapped_regions->len;
      while (iVar1 = uc->snapshot_level, uVar9 != 0) {
        pMVar3 = *(MemoryRegion **)(uc->unmapped_regions->data + uVar9 * 8 + -8);
        pMVar8 = (pMVar3->subregions).tqh_first;
        if ((pMVar3->subregions).tqh_first == (MemoryRegion *)0x0) {
          pMVar8 = pMVar3;
        }
        iVar2 = *(int *)&pMVar3->container;
        pMVar3->container = (MemoryRegion *)0x0;
        if (iVar2 < iVar1) break;
        begin = pMVar3->addr;
        IVar4 = pMVar3->size;
        a._8_8_ = unaff_RBX;
        a._0_8_ = context;
        int128_get64((Int128)a);
        _Var5 = memory_overlap(uc,begin,(size_t)IVar4);
        if (_Var5) {
          return UC_ERR_MAP;
        }
        (*uc->memory_movein)(uc,pMVar3);
        (*uc->memory_filter_subregions)(pMVar3,uc->snapshot_level);
        if ((pMVar8 != pMVar3) && ((pMVar3->subregions).tqh_first == (MemoryRegion *)0x0)) {
          (*uc->memory_unmap)(uc,(MemoryRegion *)0x0);
        }
        mem_map(uc,pMVar8);
        uVar9 = uVar9 - 1;
        g_array_remove_range(uc->unmapped_regions,(guint)uVar9,1);
      }
      uc->snapshot_level = iVar1;
      uVar6 = uc->context_content;
    }
    uVar7 = UC_ERR_OK;
    if ((uVar6 & UC_CTL_CONTEXT_CPU) != 0) {
      if (uc->context_restore != (uc_context_restore_t)0x0) {
        uVar7 = (*uc->context_restore)(uc,context);
        return uVar7;
      }
      memcpy(uc->cpu->env_ptr,&context->field_0x14,context->context_size);
      uVar7 = UC_ERR_OK;
    }
  }
  return uVar7;
}

Assistant:

UNICORN_EXPORT
uc_err uc_context_restore(uc_engine *uc, uc_context *context)
{
    UC_INIT(uc);
    uc_err ret;

    if (uc->context_content & UC_CTL_CONTEXT_MEMORY) {
        uc->snapshot_level = context->snapshot_level;
        ret = uc_restore_latest_snapshot(uc);
        if (ret != UC_ERR_OK) {
            return ret;
        }
        uc_snapshot(uc);
    }

    if (uc->context_content & UC_CTL_CONTEXT_CPU) {
        if (!uc->context_restore) {
            memcpy(uc->cpu->env_ptr, context->data, context->context_size);
            return UC_ERR_OK;
        } else {
            return uc->context_restore(uc, context);
        }
    }
    return UC_ERR_OK;
}